

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnp::Data,_(capnp::Style)1>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnp::Data,_(capnp::Style)1> *this,JsonCodec *codec,Reader input,Type type,
          Orphanage orphanage)

{
  undefined8 in_R9;
  OrphanBuilder local_30;
  
  (**(code **)(*(long *)this + 0x20))
            (&local_30,this,codec,orphanage.arena,orphanage.capTable,in_R9,
             input._reader.segment._0_4_,input._reader.capTable._0_4_,input._reader.data._0_4_,
             input._reader.pointers._0_4_,input._reader.dataSize,input._reader.nestingLimit);
  Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
            (__return_storage_ptr__,(Orphan<capnp::Data> *)&local_30);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return decode(codec, input, orphanage);
  }